

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleCongruenceClosure.cpp
# Opt level: O0

string * __thiscall
DP::SimpleCongruenceClosure::CEq::toString_abi_cxx11_(CEq *this,SimpleCongruenceClosure *parent)

{
  CPair CVar1;
  CPair CVar2;
  ostream *poVar3;
  ConstInfo *pCVar4;
  long in_RDX;
  uint *in_RSI;
  string *in_RDI;
  CPair p2;
  CPair p1;
  ostringstream res;
  Literal *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  uint local_1b0;
  uint uStack_1ac;
  uint local_1a8;
  uint uStack_1a4;
  ostringstream local_190 [376];
  long local_18;
  
  local_18 = in_RDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = (ostream *)std::ostream::operator<<(local_190,*in_RSI);
  poVar3 = std::operator<<(poVar3,"=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RSI[1]);
  std::operator<<(poVar3," implied by ");
  if ((in_RSI[2] & 1) == 0) {
    pCVar4 = Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                       ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)(local_18 + 0x10),
                        (ulong)*in_RSI);
    CVar1 = pCVar4->namedPair;
    pCVar4 = Lib::DArray<DP::SimpleCongruenceClosure::ConstInfo>::operator[]
                       ((DArray<DP::SimpleCongruenceClosure::ConstInfo> *)(local_18 + 0x10),
                        (ulong)in_RSI[1]);
    CVar2 = pCVar4->namedPair;
    poVar3 = std::operator<<((ostream *)local_190,"congruence of (");
    local_1a8 = CVar1.first;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1a8);
    poVar3 = std::operator<<(poVar3,",");
    uStack_1a4 = CVar1.second;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_1a4);
    poVar3 = std::operator<<(poVar3,") and (");
    local_1b0 = CVar2.first;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1b0);
    poVar3 = std::operator<<(poVar3,",");
    uStack_1ac = CVar2.second;
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,uStack_1ac);
    std::operator<<(poVar3,")");
  }
  else if (*(long *)(in_RSI + 4) == 0) {
    std::operator<<((ostream *)local_190,"built-in true!=false");
  }
  else {
    Kernel::operator<<(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string SimpleCongruenceClosure::CEq::toString(SimpleCongruenceClosure& parent) const
{
  std::ostringstream res;
  res << c1<<"="<<c2<<" implied by ";
  if(foOrigin) {
    if(foPremise) {
      res << (*foPremise);
    }
    else {
      res << "built-in true!=false";
    }
  }
  else {
    CPair p1= parent._cInfos[c1].namedPair;
    CPair p2= parent._cInfos[c2].namedPair;
    res << "congruence of ("<<p1.first<<","<<p1.second<<") and ("<<p2.first<<","<<p2.second<<")";
  }
  return res.str();
}